

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

DoublePrecision pnga_rand(Integer iseed)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  undefined1 local_1390 [5000];
  
  if (GA_Rand_seed == '\0') {
    uVar2 = 0x1d996;
    if (iseed != 0) {
      uVar2 = (uint)iseed;
    }
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    seedRand((ulong)uVar1);
    memcpy(&GA_Rand,local_1390,5000);
    GA_Rand_seed = '\x01';
  }
  dVar3 = genRand(&GA_Rand);
  return dVar3;
}

Assistant:

double pnga_rand(Integer iseed)
{
  double ret;
  if (GA_Rand_seed == -1) {
    unsigned long lseed;
    /* Choose a value for iseed if it has not already been set */
    if (iseed == 0) {
      iseed = 121238;
    }
    lseed = (unsigned long)(abs(iseed));
    GA_Rand = seedRand(lseed);
    GA_Rand_seed = 0;
  }
  ret = genRand(&GA_Rand); 
  return ret;
}